

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O3

Result * CoreML::validateNdMultiArrayInputType
                   (Result *__return_storage_ptr__,ArrayFeatureType *arrayType)

{
  int iVar1;
  string local_30;
  
  iVar1 = (arrayType->shape_).current_size_;
  if (iVar1 < 1) {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,
               "Input MLMultiArray to neural networks must have at least 1 dimension.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_30);
  }
  else {
    if ((arrayType->_oneof_case_[0] != 0x1f) ||
       ((((arrayType->ShapeFlexibility_).enumeratedshapes_)->shapes_).super_RepeatedPtrFieldBase.
        current_size_ == iVar1)) {
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,
               "For MLMultiArray input: Rank of the flexible shape range must match the rank of the default shape."
               ,"");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_30);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateNdMultiArrayInputType(const Specification::ArrayFeatureType& arrayType)
{
    auto rank = arrayType.shape().size();
    if (!(rank > 0)) {
        return Result(ResultType::INVALID_MODEL_INTERFACE, "Input MLMultiArray to neural networks must have at least 1 dimension.");
    }
    switch (arrayType.ShapeFlexibility_case()) {
        case CoreML::Specification::ArrayFeatureType::kEnumeratedShapes:
            break;
        case CoreML::Specification::ArrayFeatureType::kShapeRange:
            if (arrayType.shaperange().sizeranges_size() != rank) {
                return Result(ResultType::INVALID_MODEL_INTERFACE, "For MLMultiArray input: Rank of the flexible shape range must match the rank of the default shape.");
                break;
            }
        case CoreML::Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
            break;
    }

    return Result();
}